

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O3

void __thiscall
OpenMD::EAMAdapter::makeOxygenFuncfl
          (EAMAdapter *this,RealType re,RealType fe,RealType alpha,RealType beta,RealType A,
          RealType B,RealType kappa,RealType lambda,RealType drho,RealType nrho,
          vector<double,_std::allocator<double>_> *F)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  AtomType *pAVar2;
  bool bVar3;
  undefined1 local_269;
  SimpleTypeData<OpenMD::ZhouParameters> *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_260;
  RealType local_258;
  RealType local_250;
  RealType local_248;
  RealType local_240;
  RealType local_238;
  RealType local_230;
  RealType local_228;
  RealType local_220;
  shared_ptr<OpenMD::GenericData> local_218;
  shared_ptr<OpenMD::GenericData> local_208;
  shared_ptr<OpenMD::GenericData> local_1f8;
  EAMParameters local_1e8;
  FuncflParameters local_1b8;
  ZhouParameters local_138;
  
  local_258 = re;
  local_250 = fe;
  local_248 = alpha;
  local_240 = beta;
  local_238 = A;
  local_230 = B;
  local_228 = kappa;
  local_220 = lambda;
  bVar3 = AtomType::hasProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
  if (bVar3) {
    AtomType::removeProperty(this->at_,(string *)OpenMD::EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)OpenMD::ZhouTypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)OpenMD::FuncflTypeID_abi_cxx11_);
  }
  paVar1 = &local_1e8.latticeType.field_2;
  local_1e8.latticeType._M_string_length = 0;
  local_1e8.latticeType.field_2._M_local_buf[0] = '\0';
  local_1b8.atomicNumber = 0;
  local_1b8.atomicMass = 0.0;
  local_1b8.nrho = 0;
  local_1b8.drho = 0.0;
  local_1b8.nr = 0;
  local_1b8.dr = 0.0;
  local_1b8.rcut = 0.0;
  local_1b8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1b8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1b8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1b8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1b8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1e8.latticeType._M_dataplus._M_p = (pointer)paVar1;
  memset(&local_138.rhoe,0,0x100);
  local_1e8.eamType = eamOxygenFuncfl;
  local_1e8.latticeConstant = local_258;
  local_138.re = local_258;
  local_138.fe = local_250;
  local_138.alpha = local_248;
  local_138.beta = local_240;
  local_138.A = local_238;
  local_138.B = local_230;
  local_138.kappa = local_228;
  local_138.lambda = local_220;
  std::vector<double,_std::allocator<double>_>::operator=(&local_1b8.F,F);
  local_1b8.drho = drho;
  local_1b8.nrho = (int)nrho;
  pAVar2 = this->at_;
  local_268 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&_Stack_260,(SimpleTypeData<OpenMD::EAMParameters> **)&local_268,
             (allocator<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)&local_269,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::EAMtypeID_abi_cxx11_,&local_1e8);
  local_1f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_268->super_GenericData;
  local_1f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_260._M_pi;
  local_268 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar2,&local_1f8);
  if (local_1f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_260._M_pi);
  }
  pAVar2 = this->at_;
  local_268 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (&_Stack_260,&local_268,
             (allocator<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)&local_269,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::ZhouTypeID_abi_cxx11_,&local_138);
  local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_268->super_GenericData;
  local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_260._M_pi;
  local_268 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar2,&local_208);
  if (local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_260._M_pi);
  }
  pAVar2 = this->at_;
  local_268 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>,std::allocator<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>>,std::__cxx11::string_const&,OpenMD::FuncflParameters&>
            (&_Stack_260,(SimpleTypeData<OpenMD::FuncflParameters> **)&local_268,
             (allocator<OpenMD::SimpleTypeData<OpenMD::FuncflParameters>_> *)&local_269,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             OpenMD::FuncflTypeID_abi_cxx11_,&local_1b8);
  local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_268->super_GenericData;
  local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_260._M_pi;
  local_268 = (SimpleTypeData<OpenMD::ZhouParameters> *)0x0;
  _Stack_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AtomType::addProperty(pAVar2,&local_218);
  if (local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_260._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_260._M_pi);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_138.OF);
  if (local_138.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_138.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1b8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1b8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.latticeType._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8.latticeType._M_dataplus._M_p,
                    CONCAT71(local_1e8.latticeType.field_2._M_allocated_capacity._1_7_,
                             local_1e8.latticeType.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EAMAdapter::makeOxygenFuncfl(RealType re, RealType fe, RealType alpha,
                                    RealType beta, RealType A, RealType B,
                                    RealType kappa, RealType lambda,
                                    RealType drho, RealType nrho,
                                    std::vector<RealType> F) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
      at_->removeProperty(FuncflTypeID);
    }

    EAMParameters eamParam {};
    FuncflParameters funcflParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType         = eamOxygenFuncfl;
    eamParam.latticeConstant = re;
    zhouParam.re             = re;
    zhouParam.fe             = fe;
    zhouParam.alpha          = alpha;
    zhouParam.beta           = beta;
    zhouParam.A              = A;
    zhouParam.B              = B;
    zhouParam.kappa          = kappa;
    zhouParam.lambda         = lambda;

    funcflParam.F    = F;
    funcflParam.drho = drho;
    funcflParam.nrho = nrho;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
    at_->addProperty(std::make_shared<FuncflData>(FuncflTypeID, funcflParam));
  }